

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void Search::get_training_timesteps(search_private *priv,v_array<unsigned_long> *timesteps)

{
  float *pfVar1;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *pvVar2;
  long lVar3;
  pair<COST_SENSITIVE::wclass_&,_bool> *ppVar4;
  ulong *puVar5;
  pair<float,_unsigned_long> *ppVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong uVar10;
  unsigned_long *puVar11;
  ulong *puVar12;
  value_type_conflict1 __val;
  pair<COST_SENSITIVE::wclass_&,_bool> *ppVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  value_type_conflict1 __val_2;
  long lVar17;
  unsigned_long *__last;
  unsigned_long *__i;
  unsigned_long *__first;
  float fVar18;
  size_t t;
  unsigned_long local_48;
  v_array<unsigned_long> *local_40;
  ulong *local_38;
  
  v_array<unsigned_long>::clear(timesteps);
  fVar18 = priv->subsample_timesteps;
  if (fVar18 <= -1.0) {
    if ((priv->active_uncertainty)._end != (priv->active_uncertainty)._begin) {
      lVar17 = 8;
      uVar7 = 0;
      do {
        fVar18 = merand48(&priv->all->random_state);
        ppVar6 = (priv->active_uncertainty)._begin;
        pfVar1 = (float *)((long)ppVar6 + lVar17 + -8);
        if (*pfVar1 <= fVar18 && fVar18 != *pfVar1) {
          local_48 = *(long *)((long)&ppVar6->first + lVar17) - 1;
          v_array<unsigned_long>::push_back(timesteps,&local_48);
          ppVar6 = (priv->active_uncertainty)._begin;
        }
        uVar7 = uVar7 + 1;
        lVar17 = lVar17 + 0x10;
      } while (uVar7 < (ulong)((long)(priv->active_uncertainty)._end - (long)ppVar6 >> 4));
    }
  }
  else if (fVar18 <= 0.0) {
    local_48 = 0;
    uVar7 = priv->T;
    if (uVar7 != 0) {
      do {
        if ((priv->active_csoaa == true) &&
           (pvVar2 = (priv->active_known)._begin,
           local_48 < (ulong)((long)(priv->active_known)._end - (long)pvVar2 >> 5))) {
          if (pvVar2[local_48]._begin != pvVar2[local_48]._end) {
            uVar14 = 0;
            ppVar4 = pvVar2[local_48]._begin;
            do {
              ppVar13 = ppVar4 + 1;
              bVar15 = ppVar4->second & 1;
              uVar16 = uVar14 + 1;
              if (bVar15 != 0) {
                uVar14 = uVar16;
              }
            } while (((bVar15 & 1 < uVar16) == 0) &&
                    (ppVar4 = ppVar13, ppVar13 != pvVar2[local_48]._end));
            if (1 < uVar14) goto LAB_00251751;
          }
        }
        else {
LAB_00251751:
          v_array<unsigned_long>::push_back(timesteps,&local_48);
          uVar7 = priv->T;
        }
        local_48 = local_48 + 1;
      } while (local_48 < uVar7);
    }
  }
  else if (1.0 <= fVar18) {
    __first = timesteps->_begin;
    __last = timesteps->_end;
    lVar17 = (long)__last - (long)__first;
    uVar7 = lVar17 >> 3;
    local_40 = timesteps;
    if ((uVar7 < (ulong)((long)(fVar18 - 9.223372e+18) & (long)fVar18 >> 0x3f | (long)fVar18)) &&
       (uVar7 < priv->T)) {
      do {
        fVar18 = merand48(&priv->all->random_state);
        fVar18 = fVar18 * (float)priv->T;
        local_48 = (unsigned_long)fVar18;
        local_48 = (long)(fVar18 - 9.223372e+18) & (long)local_48 >> 0x3f | local_48;
        __last = local_40->_end;
        __first = local_40->_begin;
        for (puVar9 = __first; puVar9 != __last; puVar9 = puVar9 + 1) {
          if (*puVar9 == local_48) goto LAB_00251869;
        }
        v_array<unsigned_long>::push_back(timesteps,&local_48);
        __first = timesteps->_begin;
        __last = timesteps->_end;
LAB_00251869:
        lVar17 = (long)__last - (long)__first;
        uVar7 = lVar17 >> 3;
        uVar10 = (ulong)priv->subsample_timesteps;
      } while ((uVar7 < ((long)(priv->subsample_timesteps - 9.223372e+18) & (long)uVar10 >> 0x3f |
                        uVar10)) && (uVar7 < priv->T));
    }
    timesteps = local_40;
    if (__first != __last) {
      lVar3 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(unsigned_long,unsigned_long)>>
                (__first,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(unsigned_long,_unsigned_long)>)0x259211);
      puVar9 = __first;
      if (lVar17 < 0x81) {
        while (puVar12 = puVar9 + 1, puVar12 != __last) {
          uVar7 = puVar9[1];
          if (uVar7 < *__first) {
            memmove((void *)((long)puVar9 + (0x10 - ((long)puVar12 - (long)__first))),__first,
                    (long)puVar12 - (long)__first);
            puVar9 = __first;
          }
          else {
            uVar10 = *puVar9;
            puVar9 = puVar12;
            while (uVar7 < uVar10) {
              *puVar9 = uVar10;
              puVar8 = puVar9 + -2;
              puVar9 = puVar9 + -1;
              uVar10 = *puVar8;
            }
          }
          *puVar9 = uVar7;
          puVar9 = puVar12;
        }
      }
      else {
        lVar17 = 8;
        puVar11 = __first;
        do {
          puVar9 = puVar9 + 1;
          puVar12 = (ulong *)((long)__first + lVar17);
          uVar7 = *(ulong *)((long)__first + lVar17);
          if (uVar7 < *__first) {
            local_38 = puVar12;
            memmove((void *)((long)puVar11 + (0x10 - ((long)puVar12 - (long)__first))),__first,
                    (long)puVar12 - (long)__first);
            puVar8 = __first;
            puVar12 = local_38;
          }
          else {
            uVar10 = *puVar11;
            puVar8 = puVar12;
            puVar5 = puVar9;
            while (uVar7 < uVar10) {
              *puVar5 = uVar10;
              puVar8 = puVar5 + -1;
              uVar10 = puVar5[-2];
              puVar5 = puVar8;
            }
          }
          *puVar8 = uVar7;
          lVar17 = lVar17 + 8;
          puVar11 = puVar12;
        } while (lVar17 != 0x80);
        for (puVar9 = __first + 0x10; timesteps = local_40, puVar9 != __last; puVar9 = puVar9 + 1) {
          uVar10 = *puVar9;
          uVar7 = puVar9[-1];
          puVar12 = puVar9;
          while (uVar10 < uVar7) {
            *puVar12 = uVar7;
            puVar8 = puVar12 + -2;
            puVar12 = puVar12 + -1;
            uVar7 = *puVar8;
          }
          *puVar12 = uVar10;
        }
      }
    }
  }
  else {
    local_48 = 0;
    if (priv->T != 0) {
      do {
        fVar18 = merand48(&priv->all->random_state);
        if (fVar18 <= priv->subsample_timesteps) {
          v_array<unsigned_long>::push_back(timesteps,&local_48);
        }
        local_48 = local_48 + 1;
      } while (local_48 < priv->T);
    }
    if (timesteps->_end == timesteps->_begin) {
      fVar18 = merand48(&priv->all->random_state);
      fVar18 = fVar18 * (float)priv->T;
      local_48 = (unsigned_long)fVar18;
      local_48 = (long)(fVar18 - 9.223372e+18) & (long)local_48 >> 0x3f | local_48;
      v_array<unsigned_long>::push_back(timesteps,&local_48);
    }
  }
  if (priv->linear_ordering == false) {
    hoopla_permute(timesteps->_begin,timesteps->_end);
  }
  return;
}

Assistant:

void get_training_timesteps(search_private& priv, v_array<size_t>& timesteps)
{
  timesteps.clear();

  // if there's active learning, we need to
  if (priv.subsample_timesteps <= -1)
  {
    for (size_t i = 0; i < priv.active_uncertainty.size(); i++)
      if (merand48(priv.all->random_state) > priv.active_uncertainty[i].first)
        timesteps.push_back(priv.active_uncertainty[i].second - 1);
    /*
    float k = (float)priv.total_examples_generated;
    priv.ec_seq[t]->revert_weight = priv.all->loss->getRevertingWeight(priv.all->sd, priv.ec_seq[t].pred.scalar,
    priv.all->eta / powf(k, priv.all->power_t)); float importance = query_decision(active_str, *priv.ec_seq[t], k); if
    (importance > 0.) timesteps.push_back(pair<size_t,size_t>(0,t));
    */
  }
  // if there's no subsampling to do, just return [0,T)
  else if (priv.subsample_timesteps <= 0)
    for (size_t t = 0; t < priv.T; t++)
    {
      uint32_t count = 99;
      if (priv.active_csoaa && (t < priv.active_known.size()))
      {
        count = 0;
        for (pair<CS::wclass&, bool> wcq : priv.active_known[t])
          if (wcq.second)
          {
            count++;
            if (count > 1)
              break;
          }
      }
      if (count > 1)
        timesteps.push_back(t);
    }

  // if subsample in (0,1) then pick steps with that probability, but ensuring there's at least one!
  else if (priv.subsample_timesteps < 1)
  {
    for (size_t t = 0; t < priv.T; t++)
      if (merand48(priv.all->random_state) <= priv.subsample_timesteps)
        timesteps.push_back(t);

    if (timesteps.size() == 0)  // ensure at least one
      timesteps.push_back((size_t)(merand48(priv.all->random_state) * priv.T));
  }

  // finally, if subsample >= 1, then pick (int) that many uniformly at random without replacement; could use an LFSR
  // but why? :P
  else
  {
    while ((timesteps.size() < (size_t)priv.subsample_timesteps) && (timesteps.size() < priv.T))
    {
      size_t t = (size_t)(merand48(priv.all->random_state) * (float)priv.T);
      if (!v_array_contains(timesteps, t))
        timesteps.push_back(t);
    }
    std::sort(timesteps.begin(), timesteps.end(), cmp_size_t);
  }

  if (!priv.linear_ordering)
    hoopla_permute(timesteps.begin(), timesteps.end());
}